

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_utxo.cpp
# Opt level: O1

void __thiscall
cfd::CoinSelectionOption::InitializeConfidentialTxSizeInfo(CoinSelectionOption *this)

{
  bool *pbVar1;
  uint32_t uVar2;
  ConfidentialValue local_2d0;
  Script local_2a8;
  Script local_270;
  Script wpkh_script;
  ConfidentialTxOutReference txout;
  ConfidentialTxOut ctxout;
  
  pbVar1 = &ctxout.super_AbstractTxOut.value_.ignore_check_;
  ctxout.super_AbstractTxOut._vptr_AbstractTxOut = (_func_int **)pbVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&ctxout,"0014ffffffffffffffffffffffffffffffffffffffff","");
  core::Script::Script(&wpkh_script,(string *)&ctxout);
  if (ctxout.super_AbstractTxOut._vptr_AbstractTxOut != (_func_int **)pbVar1) {
    operator_delete(ctxout.super_AbstractTxOut._vptr_AbstractTxOut);
  }
  core::ConfidentialAssetId::ConfidentialAssetId((ConfidentialAssetId *)&txout);
  core::ConfidentialValue::ConfidentialValue(&local_2d0);
  core::ConfidentialTxOut::ConfidentialTxOut
            (&ctxout,&wpkh_script,(ConfidentialAssetId *)&txout,&local_2d0);
  local_2d0._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_007357f0;
  if (local_2d0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2d0.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  txout.super_AbstractTxOutReference._vptr_AbstractTxOutReference =
       (_func_int **)&PTR__ConfidentialAssetId_00735710;
  if (txout.super_AbstractTxOutReference.value_.amount_ != 0) {
    operator_delete((void *)txout.super_AbstractTxOutReference.value_.amount_);
  }
  core::ConfidentialTxOutReference::ConfidentialTxOutReference(&txout,&ctxout);
  uVar2 = core::ConfidentialTxOutReference::GetSerializeVsize
                    (&txout,true,this->exponent_,this->minimum_bits_,(uint32_t *)0x0,0);
  this->change_output_size_ = uVar2;
  core::Script::Script(&local_270);
  core::Script::Script(&local_2a8);
  uVar2 = core::ConfidentialTxIn::EstimateTxInVsize
                    (kP2wpkhAddress,&local_270,0,&local_2a8,false,false,false,(Script *)0x0,0,0x34,
                     (uint32_t *)0x0,0);
  this->change_spend_size_ = uVar2;
  core::Script::~Script(&local_2a8);
  core::Script::~Script(&local_270);
  core::ConfidentialTxOutReference::~ConfidentialTxOutReference(&txout);
  core::ConfidentialTxOut::~ConfidentialTxOut(&ctxout);
  core::Script::~Script(&wpkh_script);
  return;
}

Assistant:

void CoinSelectionOption::InitializeConfidentialTxSizeInfo() {
  // wpkh想定
  Script wpkh_script("0014ffffffffffffffffffffffffffffffffffffffff");
  ConfidentialTxOut ctxout(
      wpkh_script, ConfidentialAssetId(), ConfidentialValue());
  ConfidentialTxOutReference txout(ctxout);
  change_output_size_ =
      txout.GetSerializeVsize(true, exponent_, minimum_bits_);
  change_spend_size_ = ConfidentialTxIn::EstimateTxInVsize(
      AddressType::kP2wpkhAddress, Script(), 0, Script(), false, false);
}